

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.h
# Opt level: O3

Float __thiscall pbrt::FloatImageTexture::Evaluate(FloatImageTexture *this,TextureEvalContext ctx)

{
  float fVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  anon_class_24_3_48d30edf func;
  float fVar4;
  undefined1 auVar5 [64];
  Point2f st;
  Tuple2<pbrt::Vector2,_float> local_88;
  Tuple2<pbrt::Vector2,_float> local_80;
  Tuple2<pbrt::Vector2,_float> *local_78;
  Tuple2<pbrt::Vector2,_float> *local_70;
  Tuple2<pbrt::Point2,_float> local_68 [3];
  Tuple3<pbrt::Vector3,_float> aTStack_50 [4];
  undefined1 extraout_var [56];
  
  if ((this->super_ImageTextureBase).mipmap == (MIPMap *)0x0) {
    fVar4 = (this->super_ImageTextureBase).scale;
  }
  else {
    local_70 = &local_80;
    local_78 = &local_88;
    local_80.x = 0.0;
    local_80.y = 0.0;
    local_88.x = 0.0;
    local_88.y = 0.0;
    local_68[0].x = ctx.p.super_Tuple3<pbrt::Point3,_float>.x;
    local_68[0].y = ctx.p.super_Tuple3<pbrt::Point3,_float>.y;
    local_68[1].x = ctx.p.super_Tuple3<pbrt::Point3,_float>.z;
    local_68[1].y = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.x;
    local_68[2].x = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.y;
    local_68[2].y = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.z;
    aTStack_50[0].x = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.x;
    aTStack_50[0].y = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.y;
    aTStack_50[0].z = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.z;
    aTStack_50[1].x = ctx.uv.super_Tuple2<pbrt::Point2,_float>.x;
    aTStack_50[1].y = ctx.uv.super_Tuple2<pbrt::Point2,_float>.y;
    aTStack_50[1].z = ctx.dudx;
    aTStack_50[2].x = ctx.dudy;
    aTStack_50[2].y = ctx.dvdx;
    aTStack_50[2].z = ctx.dvdy;
    aTStack_50[3].x = (float)ctx.faceIndex;
    func.dstdx = (Vector2f **)&local_70;
    func.ctx = (TextureEvalContext *)local_68;
    func.dstdy = (Vector2f **)&local_78;
    auVar5._0_8_ = TaggedPointer<pbrt::UVMapping2D,pbrt::SphericalMapping2D,pbrt::CylindricalMapping2D,pbrt::PlanarMapping2D>
                   ::
                   Dispatch<pbrt::TextureMapping2DHandle::Map(pbrt::TextureEvalContext,pbrt::Vector2<float>*,pbrt::Vector2<float>*)const::_lambda(auto:1)_1_>
                             ((TaggedPointer<pbrt::UVMapping2D,pbrt::SphericalMapping2D,pbrt::CylindricalMapping2D,pbrt::PlanarMapping2D>
                               *)this,func);
    auVar5._8_56_ = extraout_var;
    uVar2 = vmovlps_avx(auVar5._0_16_);
    auVar3 = vmovshdup_avx(auVar5._0_16_);
    local_68[0].x = (float)uVar2;
    local_68[0].y = 1.0 - auVar3._0_4_;
    fVar1 = (this->super_ImageTextureBase).scale;
    fVar4 = MIPMap::Lookup<float>
                      ((this->super_ImageTextureBase).mipmap,(Point2f *)local_68,(Vector2f)local_80,
                       (Vector2f)local_88);
    fVar4 = fVar4 * fVar1;
  }
  return fVar4;
}

Assistant:

PBRT_CPU_GPU
    Float Evaluate(TextureEvalContext ctx) const {
#ifdef PBRT_IS_GPU_CODE
        assert(!"Should not be called in GPU code");
        return 0;
#else
        if (!mipmap)
            return scale;
        Vector2f dstdx, dstdy;
        Point2f st = mapping.Map(ctx, &dstdx, &dstdy);
        // Texture coordinates are (0,0) in the lower left corner, but
        // image coordinates are (0,0) in the upper left.
        st[1] = 1 - st[1];
        return scale * mipmap->Lookup<Float>(st, dstdx, dstdy);
#endif
    }